

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segapcm.c
# Opt level: O1

void SEGAPCM_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  undefined1 uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (*(long *)((long)chip + 0x28) != 0) {
    lVar9 = 0;
    do {
      lVar8 = *(long *)((long)chip + 8);
      bVar1 = *(byte *)(lVar8 + 0x86 + lVar9 * 8);
      if (((bVar1 & 1) == 0) && (*(char *)((long)chip + lVar9 + 0x33) == '\0')) {
        bVar2 = *(byte *)((long)chip + 0x31);
        bVar3 = *(byte *)((long)chip + 0x30);
        uVar11 = (uint)*(byte *)((long)chip + lVar9 + 0x10) |
                 (uint)*(byte *)(lVar8 + 0x84 + lVar9 * 8) << 8 |
                 (uint)*(byte *)(lVar8 + 0x85 + lVar9 * 8) << 0x10;
        if (samples != 0) {
          bVar4 = *(byte *)(lVar8 + 5 + lVar9 * 8);
          bVar5 = *(byte *)(lVar8 + 4 + lVar9 * 8);
          cVar6 = *(char *)(lVar8 + 6 + lVar9 * 8);
          uVar12 = 1;
          do {
            uVar13 = uVar11;
            if ((uVar11 >> 0x10 == (uint)(byte)(cVar6 + 1)) &&
               (bVar7 = *(byte *)(lVar8 + 0x86 + lVar9 * 8),
               uVar13 = (uint)bVar5 << 8 | (uint)bVar4 << 0x10, (bVar7 & 2) != 0)) {
              *(byte *)(lVar8 + 0x86 + lVar9 * 8) = bVar7 | 1;
              bVar14 = false;
            }
            else {
              uVar11 = (int)*(char *)(*(long *)((long)chip + 0x28) +
                                     (ulong)(uVar13 >> 8 | (uint)(bVar2 & bVar1) << (bVar3 & 0x1f)))
                       ^ 0xffffff80;
              (*outputs)[uVar12 - 1] =
                   (*outputs)[uVar12 - 1] + (*(byte *)(lVar8 + 2 + lVar9 * 8) & 0x7f) * uVar11;
              outputs[1][uVar12 - 1] =
                   outputs[1][uVar12 - 1] + (*(byte *)(lVar8 + 3 + lVar9 * 8) & 0x7f) * uVar11;
              uVar11 = *(byte *)(lVar8 + 7 + lVar9 * 8) + uVar13 & 0xffffff;
              bVar14 = true;
            }
          } while ((bVar14) && (bVar14 = uVar12 < samples, uVar12 = uVar12 + 1, bVar14));
        }
        *(char *)(lVar8 + 0x84 + lVar9 * 8) = (char)(uVar11 >> 8);
        *(char *)(lVar8 + 0x85 + lVar9 * 8) = (char)(uVar11 >> 0x10);
        uVar10 = (undefined1)uVar11;
        if ((*(byte *)(lVar8 + 0x86 + lVar9 * 8) & 1) != 0) {
          uVar10 = 0;
        }
        *(undefined1 *)((long)chip + lVar9 + 0x10) = uVar10;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x10);
  }
  return;
}

Assistant:

static void SEGAPCM_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	segapcm_state *spcm = (segapcm_state *)chip;
	int ch;

	/* clear the buffers */
	memset(outputs[0], 0, samples*sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples*sizeof(DEV_SMPL));
	if (spcm->rom == NULL)
		return;

	// reg      function
	// ------------------------------------------------
	// 0x00     ?
	// 0x01     ?
	// 0x02     volume left
	// 0x03     volume right
	// 0x04     loop address (08-15)
	// 0x05     loop address (16-23)
	// 0x06     end address
	// 0x07     address delta
	// 0x80     ?
	// 0x81     ?
	// 0x82     ?
	// 0x83     ?
	// 0x84     current address (08-15), 00-07 is internal?
	// 0x85     current address (16-23)
	// 0x86     bit 0: channel disable?
	//          bit 1: loop disable
	//          other bits: bank
	// 0x87     ?

	/* loop over channels */
	for (ch = 0; ch < 16; ch++)
	{
		UINT8 *regs = spcm->ram+8*ch;

		/* only process active channels */
		if (!(regs[0x86] & 1) && ! spcm->Muted[ch])
		{
			UINT32 offset = (regs[0x86] & spcm->bankmask) << spcm->bankshift;
			UINT32 addr = (regs[0x85] << 16) | (regs[0x84] << 8) | spcm->low[ch];
			UINT32 loop = (regs[0x05] << 16) | (regs[0x04] << 8);
			UINT8 end = regs[6] + 1;
			UINT32 i;

			/* loop over samples on this channel */
			for (i = 0; i < samples; i++)
			{
				INT8 v = 0;

				/* handle looping if we've hit the end */
				if ((addr >> 16) == end)
				{
					if (regs[0x86] & 2)
					{
						regs[0x86] |= 1;
						break;
					}
					else addr = loop;
				}

				/* fetch the sample */
				v = spcm->rom[offset | (addr >> 8)] - 0x80;
#ifdef _DEBUG
				if ((spcm->romusage[(offset | addr >> 8)] & 0x03) == 0x02 && (regs[2] || regs[3]))
					printf("Access to empty ROM section! (0x%06X)\n", offset | ((addr >> 8)));
				spcm->romusage[offset | (addr >> 8)] |= 0x01;
#endif

				/* apply panning and advance */
				// fixed Bitmask for volume multiplication, thanks to ctr -Valley Bell
				outputs[0][i] += v * (regs[2] & 0x7F);
				outputs[1][i] += v * (regs[3] & 0x7F);
				addr = (addr + regs[7]) & 0xffffff;
			}

			/* store back the updated address */
			regs[0x84] = addr >> 8;
			regs[0x85] = addr >> 16;
			spcm->low[ch] = regs[0x86] & 1 ? 0 : addr;
		}
	}
}